

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void input_binary(_Bool *target,size_t length,char *prompt)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  _Bool *p_Var4;
  ulong uVar5;
  _Bool _Var6;
  char input [1024];
  
  bVar2 = false;
  do {
    if (bVar2) {
      return;
    }
    printf("%s",prompt);
    pcVar3 = fgets(input,(int)length + 2,_stdin);
    if (pcVar3 == (char *)0x0) {
      exit(1);
    }
    bVar2 = true;
    uVar5 = 0;
    p_Var4 = target + length;
    while ((p_Var4 = p_Var4 + -1, uVar5 < length && (bVar2))) {
      _Var6 = false;
      if (input[uVar5] == '0') {
LAB_001012b7:
        *p_Var4 = _Var6;
        bVar1 = bVar2;
      }
      else {
        bVar1 = false;
        if (input[uVar5] == '1') {
          _Var6 = true;
          goto LAB_001012b7;
        }
      }
      bVar2 = bVar1;
      uVar5 = uVar5 + 1;
    }
  } while( true );
}

Assistant:

void input_binary(bool* target, const size_t length, const char* prompt) {
  char input[1024]; // should be plenty enough

  bool is_valid = false;
  while (!is_valid) {
    printf("%s", prompt);
    if (!fgets(input, (int)(length + 2), stdin)) exit(1);

    is_valid = true;

    for (size_t n = 0; n < length && is_valid; n++) {
      if (input[n] == '0') target[length - n - 1] = false;
      else if (input[n] == '1') target[length - n - 1] = true;
      else is_valid = false;
    }
  }
}